

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QPersistentModelIndex>::QList(QList<QPersistentModelIndex> *this,qsizetype size)

{
  QPersistentModelIndex *__first;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  __first = (QPersistentModelIndex *)QArrayData::allocate(&local_28,8,0x10,size,KeepSize);
  (this->d).d = (Data *)local_28;
  (this->d).ptr = __first;
  (this->d).size = 0;
  if (size != 0) {
    std::__uninitialized_default_1<false>::__uninit_default<QPersistentModelIndex*>
              (__first,__first + size);
    (this->d).size = size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }